

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_x509.cc
# Opt level: O3

X509 * d2i_X509(X509 **a,uchar **in,long len)

{
  X509 *pXVar1;
  X509 *pXVar2;
  CBS cbs;
  CBS local_28;
  
  if (len < 0) {
    pXVar2 = (X509 *)0x0;
    ERR_put_error(0xc,0,0x6b,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x_x509.cc"
                  ,0xc2);
  }
  else {
    local_28.data = *in;
    local_28.len = len;
    pXVar1 = (X509 *)x509_parse(&local_28,(CRYPTO_BUFFER *)0x0);
    pXVar2 = (X509 *)0x0;
    if (pXVar1 != (X509 *)0x0) {
      *in = local_28.data;
      pXVar2 = pXVar1;
    }
  }
  if (a != (X509 **)0x0) {
    X509_free(*a);
    *a = pXVar2;
  }
  return pXVar2;
}

Assistant:

X509 *d2i_X509(X509 **out, const uint8_t **inp, long len) {
  X509 *ret = NULL;
  if (len < 0) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_BUFFER_TOO_SMALL);
    goto err;
  }

  CBS cbs;
  CBS_init(&cbs, *inp, (size_t)len);
  ret = x509_parse(&cbs, NULL);
  if (ret == NULL) {
    goto err;
  }

  *inp = CBS_data(&cbs);

err:
  if (out != NULL) {
    X509_free(*out);
    *out = ret;
  }
  return ret;
}